

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::UniformCase::compareUniformValues
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *values,vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                  *basicUniforms)

{
  DataType DVar1;
  TestLog *pTVar2;
  pointer pVVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  pointer pBVar9;
  pointer pVVar10;
  long lVar11;
  pointer pBVar12;
  float fVar13;
  float fVar14;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  pBVar9 = (basicUniforms->
           super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(basicUniforms->
                          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9) >> 3) *
      0x286bca1b < 1) {
    bVar4 = true;
  }
  else {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    bVar4 = true;
    lVar7 = 4;
    lVar8 = 0x2c;
    lVar11 = 0;
    do {
      pVVar3 = (values->
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (undefined1  [8])pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"// Checking uniform ",0x14);
      pBVar12 = pBVar9 + lVar11;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pBVar12->name)._M_dataplus._M_p,
                 (pBVar12->name)._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pVVar10 = pVVar3 + lVar11;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (pVVar10->type != TYPE_INVALID) {
        uVar5 = glu::getDataTypeScalarSize(pVVar10->type);
        DVar1 = pVVar10->type;
        if ((DVar1 - TYPE_FLOAT < 4) ||
           (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9)) {
          if (0 < (int)uVar5) {
            uVar6 = 0;
            do {
              fVar13 = *(float *)((long)&pVVar3->type + uVar6 * 4 + lVar7) -
                       *(float *)((long)&(pBVar9->name)._M_dataplus._M_p + uVar6 * 4 + lVar8);
              fVar14 = -fVar13;
              if (-fVar13 <= fVar13) {
                fVar14 = fVar13;
              }
              if (0.05 <= fVar14) goto LAB_00f99f63;
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
        }
        else if (DVar1 - TYPE_INT < 4) {
          if (0 < (int)uVar5) {
            uVar6 = 0;
            do {
              if (*(int *)((long)&pVVar3->type + uVar6 * 4 + lVar7) !=
                  *(int *)((long)&(pBVar9->name)._M_dataplus._M_p + uVar6 * 4 + lVar8))
              goto LAB_00f99f63;
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
        }
        else if (DVar1 - TYPE_BOOL < 4) {
          if (0 < (int)uVar5) {
            uVar6 = 0;
            do {
              if (*(char *)((long)&pVVar3->type + uVar6 + lVar7) !=
                  *(char *)((long)&(pBVar9->name)._M_dataplus._M_p + uVar6 + lVar8))
              goto LAB_00f99f63;
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
        }
        else if ((DVar1 - TYPE_SAMPLER_1D < 0x1e) &&
                ((pVVar10->val).intV[0] != (pBVar12->finalValue).val.intV[0])) {
LAB_00f99f63:
          local_1b0 = (undefined1  [8])pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "// FAILURE: value obtained with glGetUniform*() for uniform ",0x3c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pBVar12->name)._M_dataplus._M_p,
                     (pBVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," differs from value set with glUniform*()",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          bVar4 = false;
        }
      }
      lVar11 = lVar11 + 1;
      pBVar9 = (basicUniforms->
               super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x44;
      lVar8 = lVar8 + 0x98;
    } while (lVar11 < (int)((ulong)((long)(basicUniforms->
                                          super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9
                                   ) >> 3) * 0x286bca1b);
  }
  return bVar4;
}

Assistant:

bool UniformCase::compareUniformValues (const vector<VarValue>& values, const vector<BasicUniform>& basicUniforms)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const VarValue&			unifValue	= values[unifNdx];

		log << TestLog::Message << "// Checking uniform " << uniform.name << TestLog::EndMessage;

		if (unifValue.type == glu::TYPE_INVALID) // This happens when glGetUniformLocation() returned -1.
			continue;

		if (!apiVarValueEquals(unifValue, uniform.finalValue))
		{
			log << TestLog::Message << "// FAILURE: value obtained with glGetUniform*() for uniform " << uniform.name << " differs from value set with glUniform*()" << TestLog::EndMessage;
			success = false;
		}
	}

	return success;
}